

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Deserializer *this,field_id_t field_id,char *tag)

{
  int iVar1;
  undefined6 in_register_00000012;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined8 local_27;
  undefined4 local_1f;
  undefined2 local_1b;
  char local_19;
  
  iVar1 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar1 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    local_38 = &local_28;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 1) = local_27;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = local_1f;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = local_1b;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = local_19;
    __return_storage_ptr__->_M_string_length = 0;
    local_30 = 0;
    local_28 = 0;
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    (*this->_vptr_Deserializer[0x1a])(__return_storage_ptr__,this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}